

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O2

void __thiscall
wabt::ExprVisitor::PushCatch(ExprVisitor *this,Expr *expr,Index catch_index,ExprList *expr_list)

{
  Index local_44;
  iterator local_40;
  Expr *local_30;
  
  local_40.list_ = (intrusive_list<wabt::Expr> *)CONCAT44(local_40.list_._4_4_,7);
  local_44 = catch_index;
  local_30 = expr;
  std::vector<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>::
  emplace_back<wabt::ExprVisitor::State>(&this->state_stack_,(State *)&local_40);
  std::vector<wabt::Expr*,std::allocator<wabt::Expr*>>::emplace_back<wabt::Expr*&>
            ((vector<wabt::Expr*,std::allocator<wabt::Expr*>> *)&this->expr_stack_,&local_30);
  local_40.node_ = expr_list->first_;
  local_40.list_ = expr_list;
  std::
  vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
  ::emplace_back<wabt::intrusive_list<wabt::Expr>::iterator>(&this->expr_iter_stack_,&local_40);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->catch_index_stack_,
             &local_44);
  return;
}

Assistant:

void ExprVisitor::PushCatch(Expr* expr,
                            Index catch_index,
                            ExprList& expr_list) {
  state_stack_.emplace_back(State::Catch);
  expr_stack_.emplace_back(expr);
  expr_iter_stack_.emplace_back(expr_list.begin());
  catch_index_stack_.emplace_back(catch_index);
}